

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

int Bac_ManFindRealIndex(Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Bac_NameType_t BVar3;
  int *piVar4;
  int iVar5;
  
  iVar1 = Bac_ObjName(p,iObj);
  iVar2 = Bac_ObjIsCi(p,iObj);
  if (iVar2 == 0) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xff,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
  }
  BVar3 = Bac_NameType(iVar1);
  if (BVar3 != BAC_NAME_BIN) {
    BVar3 = Bac_NameType(iVar1);
    iVar2 = 0;
    if (BVar3 == BAC_NAME_INDEX) {
      iVar2 = Abc_Lit2Var2(iVar1);
      iVar1 = Bac_ObjName(p,iObj - iVar2);
    }
    BVar3 = Bac_NameType(iVar1);
    if (BVar3 == BAC_NAME_INFO) {
      iVar1 = Abc_Lit2Var2(iVar1);
      piVar4 = Vec_IntEntryP(&p->vInfo,iVar1 * 3);
      iVar1 = piVar4[1];
      if (iVar1 < 0) {
        __assert_fail("a[1]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0xf8,"int Bac_NtkInfoIndex(Bac_Ntk_t *, int, int)");
      }
      iVar5 = -iVar2;
      if (iVar1 < piVar4[2]) {
        iVar5 = iVar2;
      }
      iVar2 = iVar5 + iVar1;
    }
    else {
      BVar3 = Bac_NameType(iVar1);
      if (BVar3 != BAC_NAME_WORD) {
        __assert_fail("Bac_NameType(NameId) == BAC_NAME_WORD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x105,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
      }
    }
    return iVar2;
  }
  __assert_fail("Bac_NameType(NameId) != BAC_NAME_BIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                ,0x100,"int Bac_ManFindRealIndex(Bac_Ntk_t *, int)");
}

Assistant:

static inline int Bac_ManFindRealIndex( Bac_Ntk_t * p, int iObj )
{
    int iBit = 0, NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
    assert( Bac_NameType(NameId) != BAC_NAME_BIN );
    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
        NameId = Bac_ObjName(p, iObj - (iBit = Abc_Lit2Var2(NameId)));
    if ( Bac_NameType(NameId) == BAC_NAME_INFO )
        return Bac_NtkInfoIndex(p, Abc_Lit2Var2(NameId), iBit);
    assert( Bac_NameType(NameId) == BAC_NAME_WORD );
    return iBit;
}